

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1359::run(TestCase1359 *this)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Builder root;
  Builder root_1;
  MallocMessageBuilder builder;
  StructReader local_2d8;
  StructBuilder local_2a8;
  int local_280;
  StructBuilder local_278;
  StructBuilder local_250;
  StructBuilder local_228;
  void *in_stack_fffffffffffffe10;
  WirePointer *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  SegmentReader *in_stack_fffffffffffffe28;
  CapTableReader *in_stack_fffffffffffffe30;
  void *local_1c8;
  WirePointer *pWStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  StructReader local_1a8;
  StructReader local_178;
  StructReader local_148;
  PointerReader local_118;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_278,&local_f8.super_MessageBuilder);
  local_2d8.data = local_278.data;
  PointerBuilder::getStruct(&local_2a8,(PointerBuilder *)&local_2d8,(StructSize)0x10000,(word *)0x0)
  ;
  local_2d8.segment = &(local_2a8.segment)->super_SegmentReader;
  local_2d8.capTable = &(local_2a8.capTable)->super_CapTableReader;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffe00,(PointerBuilder *)&local_2d8,
             (StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe18;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10;
  builder_00._builder.data = (void *)in_stack_fffffffffffffe20;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffe28;
  builder_00._builder._32_8_ = in_stack_fffffffffffffe30;
  initTestMessage(builder_00);
  StructBuilder::asReader(&local_2a8);
  bVar1 = local_2d8.pointerCount == 0;
  local_278.data = local_2d8.pointers;
  if (bVar1) {
    local_278.data = (WirePointer *)0x0;
  }
  local_278.pointers._0_4_ = 0x7fffffff;
  if (!bVar1) {
    local_278.pointers._0_4_ = local_2d8.nestingLimit;
  }
  local_278.segment._0_4_ = 0;
  local_278.segment._4_4_ = 0;
  local_278.capTable._0_4_ = 0;
  local_278.capTable._4_4_ = 0;
  if (!bVar1) {
    local_278.segment._0_4_ = local_2d8.segment._0_4_;
    local_278.segment._4_4_ = local_2d8.segment._4_4_;
    local_278.capTable._0_4_ = local_2d8.capTable._0_4_;
    local_278.capTable._4_4_ = local_2d8.capTable._4_4_;
  }
  PointerReader::getStruct(&local_148,(PointerReader *)&local_278,(word *)0x0);
  reader._reader.capTable = local_148.capTable;
  reader._reader.segment = local_148.segment;
  reader._reader.data = local_148.data;
  reader._reader.pointers = local_148.pointers;
  reader._reader.dataSize = local_148.dataSize;
  reader._reader.pointerCount = local_148.pointerCount;
  reader._reader._38_2_ = local_148._38_2_;
  reader._reader.nestingLimit = local_148.nestingLimit;
  reader._reader._44_4_ = local_148._44_4_;
  checkTestMessage(reader);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_2a8,&local_f8.super_MessageBuilder);
  local_2d8.data = local_2a8.data;
  local_2d8.segment = &(local_2a8.segment)->super_SegmentReader;
  local_2d8.capTable = &(local_2a8.capTable)->super_CapTableReader;
  PointerBuilder::getStruct(&local_278,(PointerBuilder *)&local_2d8,(StructSize)0x30000,(word *)0x0)
  ;
  local_2d8.data = (void *)CONCAT44(local_278.pointers._4_4_,(int)local_278.pointers);
  local_2d8.segment._0_4_ = local_278.segment._0_4_;
  local_2d8.segment._4_4_ = local_278.segment._4_4_;
  local_2d8.capTable._0_4_ = local_278.capTable._0_4_;
  local_2d8.capTable._4_4_ = local_278.capTable._4_4_;
  PointerBuilder::initStruct(&local_228,(PointerBuilder *)&local_2d8,(StructSize)0x140006);
  builder_01._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe18;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10;
  builder_01._builder.data = (void *)in_stack_fffffffffffffe20;
  builder_01._builder.pointers = (WirePointer *)in_stack_fffffffffffffe28;
  builder_01._builder._32_8_ = in_stack_fffffffffffffe30;
  initTestMessage(builder_01);
  StructBuilder::asReader(&local_278);
  bVar1 = local_2d8.pointerCount == 0;
  local_2a8.data = local_2d8.pointers;
  if (bVar1) {
    local_2a8.data = (WirePointer *)0x0;
  }
  local_2a8.pointers._0_4_ = 0x7fffffff;
  if (!bVar1) {
    local_2a8.pointers._0_4_ = local_2d8.nestingLimit;
  }
  uVar2 = 0;
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  if (!bVar1) {
    uVar2 = local_2d8.segment._0_4_;
    uVar3 = local_2d8.segment._4_4_;
    uVar4 = local_2d8.capTable._0_4_;
    uVar5 = local_2d8.capTable._4_4_;
  }
  local_2a8.segment = (SegmentBuilder *)CONCAT44(uVar3,uVar2);
  local_2a8.capTable = (CapTableBuilder *)CONCAT44(uVar5,uVar4);
  PointerReader::getStruct(&local_178,(PointerReader *)&local_2a8,(word *)0x0);
  reader_00._reader.capTable = local_178.capTable;
  reader_00._reader.segment = local_178.segment;
  reader_00._reader.data = local_178.data;
  reader_00._reader.pointers = local_178.pointers;
  reader_00._reader.dataSize = local_178.dataSize;
  reader_00._reader.pointerCount = local_178.pointerCount;
  reader_00._reader._38_2_ = local_178._38_2_;
  reader_00._reader.nestingLimit = local_178.nestingLimit;
  reader_00._reader._44_4_ = local_178._44_4_;
  checkTestMessage(reader_00);
  local_2d8.segment = (SegmentReader *)0x0;
  local_2d8.capTable = (CapTableReader *)0x0;
  local_2d8.data = &schemas::b_a0a8f314b80b63fd;
  local_2d8.pointers = (WirePointer *)CONCAT44(local_2d8.pointers._4_4_,0x7fffffff);
  PointerReader::getStruct(&local_1a8,(PointerReader *)&local_2d8,(word *)0x0);
  local_2d8.dataSize = local_1a8.dataSize;
  local_2d8.pointerCount = local_1a8.pointerCount;
  local_2d8._38_2_ = local_1a8._38_2_;
  local_2d8.nestingLimit = local_1a8.nestingLimit;
  local_2d8._44_4_ = local_1a8._44_4_;
  local_2d8.data = local_1a8.data;
  local_2d8.pointers = local_1a8.pointers;
  local_2d8.segment = local_1a8.segment;
  local_2d8.capTable = local_1a8.capTable;
  local_2a8.data = (void *)(CONCAT44(local_278.pointers._4_4_,(int)local_278.pointers) + 8);
  local_2a8.segment = (SegmentBuilder *)CONCAT44(local_278.segment._4_4_,local_278.segment._0_4_);
  local_2a8.capTable =
       (CapTableBuilder *)CONCAT44(local_278.capTable._4_4_,local_278.capTable._0_4_);
  PointerBuilder::setStruct((PointerBuilder *)&local_2a8,&local_2d8,false);
  local_2a8.data = (void *)(CONCAT44(local_278.pointers._4_4_,(int)local_278.pointers) + 0x10);
  local_2a8.segment = (SegmentBuilder *)CONCAT44(local_278.segment._4_4_,local_278.segment._0_4_);
  local_2a8.capTable =
       (CapTableBuilder *)CONCAT44(local_278.capTable._4_4_,local_278.capTable._0_4_);
  PointerBuilder::initStruct
            ((StructBuilder *)&local_2d8,(PointerBuilder *)&local_2a8,(StructSize)0x10000);
  local_2a8.segment = (SegmentBuilder *)local_2d8.segment;
  local_2a8.capTable = (CapTableBuilder *)local_2d8.capTable;
  local_2a8.data = local_2d8.pointers;
  PointerBuilder::initStruct(&local_250,(PointerBuilder *)&local_2a8,(StructSize)0x140006);
  builder_02._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe18;
  builder_02._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe10;
  builder_02._builder.data = (void *)in_stack_fffffffffffffe20;
  builder_02._builder.pointers = (WirePointer *)in_stack_fffffffffffffe28;
  builder_02._builder._32_8_ = in_stack_fffffffffffffe30;
  initTestMessage(builder_02);
  StructBuilder::asReader(&local_278);
  local_118.pointer =
       (WirePointer *)(CONCAT44(local_2a8.pointers._4_4_,(int)local_2a8.pointers) + 0x10);
  if (local_2a8.pointerCount < 3) {
    local_118.pointer = (WirePointer *)0x0;
  }
  if (local_2a8.pointerCount < 3) {
    local_118.segment._0_4_ = 0;
    local_118.segment._4_4_ = 0;
    local_118.capTable._0_4_ = 0;
    local_118.capTable._4_4_ = 0;
    local_280 = 0x7fffffff;
  }
  else {
    local_118.segment._0_4_ = local_2a8.segment._0_4_;
    local_118.segment._4_4_ = local_2a8.segment._4_4_;
    local_118.capTable._0_4_ = local_2a8.capTable._0_4_;
    local_118.capTable._4_4_ = local_2a8.capTable._4_4_;
  }
  local_118.nestingLimit = local_280;
  PointerReader::getStruct(&local_2d8,&local_118,(word *)0x0);
  bVar1 = local_2d8.pointerCount == 0;
  local_118.pointer = local_2d8.pointers;
  if (bVar1) {
    local_118.pointer = (WirePointer *)0x0;
  }
  local_118.nestingLimit = 0x7fffffff;
  if (!bVar1) {
    local_118.nestingLimit = local_2d8.nestingLimit;
  }
  local_118.segment._0_4_ = 0;
  local_118.segment._4_4_ = 0;
  local_118.capTable._0_4_ = 0;
  local_118.capTable._4_4_ = 0;
  if (!bVar1) {
    local_118.segment._0_4_ = local_2d8.segment._0_4_;
    local_118.segment._4_4_ = local_2d8.segment._4_4_;
    local_118.capTable._0_4_ = local_2d8.capTable._0_4_;
    local_118.capTable._4_4_ = local_2d8.capTable._4_4_;
  }
  PointerReader::getStruct((StructReader *)&stack0xfffffffffffffe28,&local_118,(word *)0x0);
  reader_01._reader.capTable = in_stack_fffffffffffffe30;
  reader_01._reader.segment = in_stack_fffffffffffffe28;
  reader_01._reader.data = local_1c8;
  reader_01._reader.pointers = pWStack_1c0;
  reader_01._reader._32_8_ = local_1b8;
  reader_01._reader._40_8_ = uStack_1b0;
  checkTestMessage(reader_01);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Encoding, Imports) {
  // Also just testing the generated code.

  {
    MallocMessageBuilder builder;
    TestImport::Builder root = builder.getRoot<TestImport>();
    initTestMessage(root.initField());
    checkTestMessage(root.asReader().getField());
  }

  {
    MallocMessageBuilder builder;
    TestImport2::Builder root = builder.getRoot<TestImport2>();
    initTestMessage(root.initFoo());
    checkTestMessage(root.asReader().getFoo());
    root.setBar(schemaProto<TestAllTypes>());
    initTestMessage(root.initBaz().initField());
    checkTestMessage(root.asReader().getBaz().getField());
  }
}